

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFileTest.cpp
# Opt level: O0

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
EvilConfig::from_config
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          EvilConfig *this,istream *param_1)

{
  FileError *this_00;
  allocator local_41;
  string local_40;
  istream *local_20;
  istream *param_1_local;
  EvilConfig *this_local;
  
  local_20 = param_1;
  param_1_local = (istream *)this;
  this_local = (EvilConfig *)__return_storage_ptr__;
  this_00 = (FileError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"evil",&local_41);
  CLI::FileError::FileError(this_00,&local_40);
  __cxa_throw(this_00,&CLI::FileError::typeinfo,CLI::FileError::~FileError);
}

Assistant:

std::vector<CLI::ConfigItem> from_config(std::istream &) const override { throw CLI::FileError("evil"); }